

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

MM<45UL> __thiscall
GF2::MI<45UL,_GF2::MOGrlex<45UL>_>::GatherVars(MI<45UL,_GF2::MOGrlex<45UL>_> *this)

{
  bool bVar1;
  list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *in_RDI;
  const_iterator iterPoly;
  const_iterator iter;
  MM<45UL> *vars;
  WW<45UL> this_00;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  _Self local_18 [3];
  
  this_00._words[0] = (word  [1])(word  [1])in_RDI;
  MM<45UL>::MM((MM<45UL> *)0x1e0cc9);
  local_18[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
       ::begin((list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                *)in_RDI);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
         ::end((list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                *)in_RDI);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator->
              ((_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1e0d06);
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin(in_RDI);
    while( true ) {
      std::_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator->
                ((_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1e0d1d);
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end(in_RDI);
      bVar1 = std::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      std::_List_const_iterator<GF2::MM<45UL>_>::operator*
                ((_List_const_iterator<GF2::MM<45UL>_> *)this_00._words[0]);
      MM<45ul>::operator*=((MM<45UL> *)this_00._words[0],(MM<45UL> *)in_RDI);
      std::_List_const_iterator<GF2::MM<45UL>_>::operator++(&local_28);
    }
    std::_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator++(local_18);
  }
  return (WW<45UL>)(WW<45UL>)this_00._words[0];
}

Assistant:

MM<_n> GatherVars() const
	{	
		MM<_n> vars;
		for (const_iterator iter = begin(); iter != end(); ++iter)
		{
			auto iterPoly = iter->begin();
			for (; iterPoly != iter->end(); ++iterPoly)
				vars *= *iterPoly;
		}
		return vars;
	}